

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::PortSymbol::fromSyntax
          (PortSymbol *this,PortListSyntax *syntax,Scope *scope,
          SmallVectorBase<const_slang::ast::Symbol_*> *results,
          SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>
          *implicitMembers,
          span<const_std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_18446744073709551615UL>
          portDeclarations)

{
  SyntaxNode **ppSVar1;
  uchar *puVar2;
  group_type_pointer pgVar3;
  SyntaxKind SVar4;
  pointer ppVar5;
  Symbol *pSVar6;
  PortConcatenationSyntax *pPVar7;
  InterfacePortHeaderSyntax *header;
  DeclaratorSyntax *pDVar8;
  int *piVar9;
  uint uVar10;
  span<const_slang::syntax::VariableDimensionSyntax_*const,_18446744073709551615UL>
  unpackedDimensions;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attrs;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attrs_00;
  string_view modport;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  size_t *psVar13;
  undefined8 uVar14;
  undefined1 auVar15 [8];
  slot_type *psVar16;
  bool bVar17;
  int iVar18;
  ArgumentDirection AVar19;
  SourceLocation SVar20;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
  *ppVar21;
  NetSymbol *pNVar22;
  Symbol *pSVar23;
  slot_type *psVar24;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar25;
  PortSymbol *pPVar26;
  Scope *scope_00;
  NetType *pNVar27;
  Symbol *pSVar28;
  undefined7 extraout_var;
  Diagnostic *pDVar29;
  ImplicitTypeSyntax *pIVar30;
  uint uVar31;
  SymbolIndex SVar32;
  SyntaxNode *pSVar33;
  size_t sVar34;
  DataTypeSyntax *pDVar35;
  SyntaxNode *type;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
  *ppVar36;
  not_null<const_slang::syntax::DeclaratorSyntax_*> iface;
  NetPortHeaderSyntax *netHeader;
  byte *pbVar37;
  ulong uVar38;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar39;
  arrays_type *paVar40;
  bitmask<slang::ast::LookupFlags> flags;
  arrays_type *paVar41;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
  *in_R9;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
  *ppVar42;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
  *ppVar43;
  arrays_type *paVar44;
  arrays_type *paVar45;
  long lVar46;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
  *ppVar47;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
  *unaff_R14;
  slot_type *psVar48;
  DefinitionSymbol *iface_00;
  type *name_4;
  Token *pTVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  uchar uVar54;
  uchar uVar56;
  uchar uVar57;
  uchar uVar58;
  uchar uVar59;
  uchar uVar60;
  uchar uVar61;
  uchar uVar62;
  uchar uVar63;
  uchar uVar64;
  uchar uVar65;
  uchar uVar66;
  uchar uVar67;
  uchar uVar68;
  uchar uVar69;
  uchar uVar70;
  undefined1 auVar55 [16];
  Token TVar71;
  string_view sVar72;
  SourceRange SVar73;
  string_view name_00;
  string_view name_01;
  PortDeclarationSyntax *port;
  SourceLocation declLoc;
  locator res;
  Token name;
  string_view name_3;
  value_type *elements_1;
  value_type *elements;
  AnsiPortListBuilder builder;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffb48;
  PortInfo *in_stack_fffffffffffffb50;
  __extent_storage<18446744073709551615UL> _Var74;
  undefined1 local_498 [8];
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
  *local_490;
  locator local_488;
  PortSymbol *local_470;
  undefined1 local_468 [24];
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
  *local_450;
  Token *local_448;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
  *local_440;
  Scope *local_438;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
  local_430;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
  *local_3d8;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
  *local_3d0;
  Scope *local_3c8;
  SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *local_3c0;
  arrays_type *local_3b8;
  arrays_type *local_3b0;
  arrays_type *local_3a8;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> local_3a0;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
  *local_398;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
  *local_390;
  undefined8 local_388;
  uchar uStack_380;
  uchar uStack_37f;
  uchar uStack_37e;
  uchar uStack_37d;
  uchar uStack_37c;
  uchar uStack_37b;
  uchar uStack_37a;
  uchar uStack_379;
  Symbol *local_370;
  DefinitionSymbol *local_368;
  ulong local_360;
  undefined1 local_358 [32];
  undefined1 local_338 [16];
  DefinitionSymbol *local_328;
  char cStack_320;
  char acStack_31f [7];
  NetType *local_318;
  bool local_310;
  Storage *local_78;
  undefined1 local_70 [32];
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
  *ppStack_50;
  ulong local_48;
  ulong local_40;
  
  local_470 = this;
  local_438 = scope;
  local_3c8 = (Scope *)syntax;
  local_3c0 = implicitMembers;
  local_358._8_8_ = syntax;
  local_358._16_8_ = results;
  if ((this->super_Symbol).kind == AssociativeArrayType) {
    local_358._0_8_ = *(undefined8 *)&syntax->super_SyntaxNode;
    local_358._24_4_ = InOut;
    local_338 = (undefined1  [16])0x0;
    local_328 = (DefinitionSymbol *)0x0;
    cStack_320 = '\0';
    acStack_31f[0] = '\0';
    acStack_31f[1] = '\0';
    acStack_31f[2] = '\0';
    acStack_31f[3] = '\0';
    acStack_31f[4] = '\0';
    acStack_31f[5] = '\0';
    acStack_31f[6] = '\0';
    local_318 = (NetType *)0x0;
    local_310 = false;
    pbVar37 = (byte *)((long)&(this->type->super_Symbol).kind + 1);
    local_398 = in_R9;
    if ((byte *)0x1 < pbVar37) {
      uVar38 = (ulong)pbVar37 >> 1;
      lVar46 = 0;
      do {
        ppSVar25 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                             ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                              (*(long *)&this->direction + lVar46));
        uVar14 = local_358._0_8_;
        pSVar39 = *ppSVar25;
        if (pSVar39->kind == ImplicitAnsiPort) {
          header = (InterfacePortHeaderSyntax *)pSVar39[3].parent;
          pDVar8 = (DeclaratorSyntax *)pSVar39[3].previewNode;
          SVar4 = (header->super_PortHeaderSyntax).super_SyntaxNode.kind;
          if (SVar4 == InterfacePortHeader) {
            if ((header->nameOrKeyword).kind == InterfaceKeyword) {
              if (header->modport == (DotMemberClauseSyntax *)0x0) {
                TVar71 = (Token)ZEXT816(0);
              }
              else {
                TVar71 = (Token)parsing::Token::valueText(&header->modport->member);
              }
              pSVar33 = pSVar39[2].previewNode;
              _Var74._M_extent_value = *(size_t *)(pSVar39 + 3);
              local_430.first =
                   *(basic_string_view<char,_std::char_traits<char>_> *)&pSVar39[2].previewNode;
              bVar17 = true;
              iface.ptr = (DeclaratorSyntax *)(DefinitionSymbol *)0x0;
            }
            else {
              anon_unknown_0::getInterfacePortInfo
                        ((tuple<const_slang::ast::DefinitionSymbol_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
                          *)&local_430,(Scope *)local_358._8_8_,header);
              pSVar33 = pSVar39[2].previewNode;
              _Var74._M_extent_value = *(size_t *)(pSVar39 + 3);
              local_488._0_16_ = *(undefined1 (*) [16])&pSVar39[2].previewNode;
              bVar17 = false;
              iface.ptr = local_430.second.syntax.ptr;
              TVar71 = (Token)local_430.first;
            }
            attrs_00._M_extent._M_extent_value = _Var74._M_extent_value;
            attrs_00._M_ptr = (pointer)pSVar33;
            pSVar28 = anon_unknown_0::AnsiPortListBuilder::add
                                ((AnsiPortListBuilder *)local_358,pDVar8,
                                 (DefinitionSymbol *)iface.ptr,(string_view)TVar71,bVar17,attrs_00);
          }
          else {
            if (SVar4 == NetPortHeader) {
              AVar19 = local_358._24_4_;
              if ((header->nameOrKeyword).info != (Info *)0x0) {
                AVar19 = SemanticFacts::getDirection((header->nameOrKeyword).kind);
              }
              type = header[1].super_PortHeaderSyntax.super_SyntaxNode.parent;
              pNVar27 = Compilation::getNetType
                                  ((Compilation *)local_358._0_8_,*(TokenKind *)&header->modport);
              pSVar33 = pSVar39[2].previewNode;
              _Var74._M_extent_value = *(size_t *)(pSVar39 + 3);
              local_430.first =
                   *(basic_string_view<char,_std::char_traits<char>_> *)&pSVar39[2].previewNode;
LAB_00283c81:
              attrs._M_extent._M_extent_value = _Var74._M_extent_value;
              attrs._M_ptr = (pointer)pSVar33;
              pSVar28 = anon_unknown_0::AnsiPortListBuilder::add
                                  ((AnsiPortListBuilder *)local_358,pDVar8,AVar19,
                                   (DataTypeSyntax *)type,pNVar27,attrs);
            }
            else {
              if ((((*(long *)&header[1].super_PortHeaderSyntax.super_SyntaxNode != 0) ||
                   (header[1].super_PortHeaderSyntax.super_SyntaxNode.previewNode !=
                    (SyntaxNode *)0x0)) ||
                  (piVar9 = *(int **)&header[1].nameOrKeyword, *piVar9 != 0xf7)) ||
                 ((*(long *)(piVar9 + 8) != 0 || (*(long *)(piVar9 + 0x16) != 0)))) {
                local_448 = (Token *)&header->modport;
                sVar72 = slang::syntax::SyntaxFacts::getSimpleTypeName
                                   (*(DataTypeSyntax **)&header[1].nameOrKeyword);
                name_01._M_len =
                     (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                      *)sVar72._M_str;
                scope_00 = (Scope *)sVar72._M_len;
                if (scope_00 != (Scope *)0x0) {
                  name_01._M_str = (char *)0x1;
                  local_450 = name_01._M_len;
                  pNVar27 = (NetType *)
                            Lookup::unqualified((Lookup *)local_358._8_8_,scope_00,name_01,
                                                (bitmask<slang::ast::LookupFlags>)
                                                (underlying_type)implicitMembers);
                  if (pNVar27 == (NetType *)0x0) {
LAB_00283ca5:
                    sVar72._M_str = (char *)local_450;
                    sVar72._M_len = (size_t)scope_00;
                    ppVar36 = local_450;
                    implicitMembers =
                         (SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>
                          *)local_358._8_8_;
                    pSVar28 = (Symbol *)
                              Compilation::tryGetDefinition
                                        ((DefinitionLookupResult *)&local_430,
                                         (Compilation *)local_358._0_8_,sVar72,
                                         (Scope *)local_358._8_8_);
                    uVar14 = local_358._8_8_;
                    iface_00 = (DefinitionSymbol *)local_430.first._M_len;
                    bVar17 = true;
                    if (((DefinitionSymbol *)local_430.first._M_len != (DefinitionSymbol *)0x0) &&
                       (((Symbol *)local_430.first._M_len)->kind == Definition)) {
                      if (*(DefinitionKind *)(local_430.first._M_len + 0x48) == Interface) {
                        if (header[1].super_PortHeaderSyntax.super_SyntaxNode.previewNode !=
                            (SyntaxNode *)0x0) {
                          SVar20 = parsing::Token::location
                                             ((Token *)&header[1].super_PortHeaderSyntax.
                                                        super_SyntaxNode.parent);
                          Scope::addDiag((Scope *)uVar14,(DiagCode)0xd80006,SVar20);
                        }
                        uVar14 = local_358._8_8_;
                        if (*(long *)&header[1].super_PortHeaderSyntax.super_SyntaxNode != 0) {
                          SVar20 = parsing::Token::location(local_448);
                          Scope::addDiag((Scope *)uVar14,(DiagCode)0x2e0006,SVar20);
                        }
                      }
                      else {
                        SVar73 = slang::syntax::SyntaxNode::sourceRange
                                           (*(SyntaxNode **)&header[1].nameOrKeyword);
                        pDVar29 = Scope::addDiag((Scope *)uVar14,(DiagCode)0xa10006,SVar73);
                        Diagnostic::operator<<(pDVar29,(iface_00->super_Symbol).name);
                        Diagnostic::addNote(pDVar29,(DiagCode)0x50001,
                                            (iface_00->super_Symbol).location);
                        iface_00 = (DefinitionSymbol *)0x0;
                      }
                      local_430.first =
                           *(basic_string_view<char,_std::char_traits<char>_> *)
                            &pSVar39[2].previewNode;
                      bVar17 = false;
                      ppVar36 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                                 *)0x0;
                      implicitMembers =
                           (SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>
                            *)0x48a5a6;
                      pSVar28 = anon_unknown_0::AnsiPortListBuilder::add
                                          ((AnsiPortListBuilder *)local_358,pDVar8,iface_00,
                                           (string_view)(ZEXT816(0x48a5a6) << 0x40),false,
                                           *(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                                             *)&pSVar39[2].previewNode);
                    }
                  }
                  else if ((pNVar27->super_Symbol).kind == NetType) {
                    AVar19 = local_358._24_4_;
                    if (*(long *)&header[1].super_PortHeaderSyntax.super_SyntaxNode != 0) {
                      AVar19 = SemanticFacts::getDirection(local_448->kind);
                    }
                    local_430.first =
                         *(basic_string_view<char,_std::char_traits<char>_> *)
                          &pSVar39[2].previewNode;
                    ppVar36 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                               *)0x0;
                    bVar17 = false;
                    pSVar28 = anon_unknown_0::AnsiPortListBuilder::add
                                        ((AnsiPortListBuilder *)local_358,pDVar8,AVar19,
                                         (DataTypeSyntax *)0x0,pNVar27,
                                         *(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                                           *)&pSVar39[2].previewNode);
                    implicitMembers =
                         (SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>
                          *)pNVar27;
                  }
                  else {
                    bVar17 = Symbol::isType((Symbol *)pNVar27);
                    pSVar28 = (Symbol *)CONCAT71(extraout_var,bVar17);
                    ppVar36 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                               *)((ulong)pSVar28 & 0xffffffff);
                    bVar17 = true;
                    if ((char)ppVar36 == '\0') goto LAB_00283ca5;
                  }
                  TVar71.info = (Info *)implicitMembers;
                  TVar71._0_8_ = ppVar36;
                  this = local_470;
                  if (!bVar17) goto LAB_00283f09;
                }
                AVar19 = local_358._24_4_;
                if (*(long *)&header[1].super_PortHeaderSyntax.super_SyntaxNode != 0) {
                  AVar19 = SemanticFacts::getDirection(local_448->kind);
                }
                uVar14 = local_358._8_8_;
                if (header[1].super_PortHeaderSyntax.super_SyntaxNode.previewNode ==
                    (SyntaxNode *)0x0) {
                  if ((AVar19 == InOut) ||
                     ((AVar19 != Ref && (**(int **)&header[1].nameOrKeyword == 0xf7)))) {
                    SVar20 = parsing::Token::location(&pDVar8->name);
                    pNVar27 = anon_unknown_0::getDefaultNetType((Scope *)uVar14,SVar20);
                    this = local_470;
                  }
                  else {
                    pNVar27 = (NetType *)0x0;
                    this = local_470;
                  }
                }
                else {
                  pNVar27 = (NetType *)0x0;
                }
                pDVar35 = *(DataTypeSyntax **)&header[1].nameOrKeyword;
                local_488._0_16_ = *(undefined1 (*) [16])&pSVar39[2].previewNode;
                pSVar28 = anon_unknown_0::AnsiPortListBuilder::add
                                    ((AnsiPortListBuilder *)local_358,pDVar8,AVar19,pDVar35,pNVar27,
                                     *(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                                       *)&pSVar39[2].previewNode);
                TVar71.info = (Info *)pNVar27;
                TVar71._0_8_ = pDVar35;
                goto LAB_00283f09;
              }
              ppSVar1 = &pSVar39[2].previewNode;
              pSVar33 = *ppSVar1;
              _Var74._M_extent_value = *(size_t *)(pSVar39 + 3);
              TVar71 = *(Token *)ppSVar1;
              if ((local_328 == (DefinitionSymbol *)0x0) && (local_310 != true)) {
                pNVar27 = (NetType *)local_338._8_8_;
                if ((DataTypeSyntax *)local_338._0_8_ == (DataTypeSyntax *)0x0 &&
                    (NetType *)local_338._8_8_ == (NetType *)0x0) {
                  local_488._0_16_ = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)pDVar8);
                  SVar20 = parsing::Token::location((Token *)&local_488);
                  pIVar30 = Compilation::createEmptyTypeSyntax((Compilation *)uVar14,SVar20);
                  local_338._0_8_ = pIVar30;
                }
                type = (SyntaxNode *)local_338._0_8_;
                AVar19 = local_358._24_4_;
                local_468._0_16_ = (undefined1  [16])TVar71;
                goto LAB_00283c81;
              }
              type = (SyntaxNode *)CONCAT71(acStack_31f,cStack_320);
              modport._M_len._1_1_ = acStack_31f[0];
              modport._M_len._2_1_ = acStack_31f[1];
              modport._M_len._3_1_ = acStack_31f[2];
              modport._M_len._4_1_ = acStack_31f[3];
              modport._M_len._5_1_ = acStack_31f[4];
              modport._M_len._6_1_ = acStack_31f[5];
              modport._M_len._7_1_ = acStack_31f[6];
              modport._M_len._0_1_ = cStack_320;
              modport._M_str = (char *)local_318;
              pNVar27 = local_318;
              local_430.first = *(basic_string_view<char,_std::char_traits<char>_> *)ppSVar1;
              pSVar28 = anon_unknown_0::AnsiPortListBuilder::add
                                  ((AnsiPortListBuilder *)local_358,pDVar8,local_328,modport,
                                   local_310,
                                   *(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                                     *)ppSVar1);
            }
            TVar71.info = (Info *)pNVar27;
            TVar71._0_8_ = type;
            this = local_470;
          }
LAB_00283f09:
          local_430.first._M_len = (size_t)pSVar28;
        }
        else {
          local_430.first = parsing::Token::valueText((Token *)&pSVar39[4].previewNode);
          SVar20 = parsing::Token::location((Token *)&pSVar39[4].previewNode);
          local_488.pg = (group15<boost::unordered::detail::foa::plain_integral> *)SVar20;
          local_468[0] = 1;
          pPVar26 = BumpAllocator::
                    emplace<slang::ast::PortSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,bool>
                              ((BumpAllocator *)uVar14,&local_430.first,(SourceLocation *)&local_488
                               ,(bool *)local_468);
          AVar19 = local_358._24_4_;
          if (pSVar39[3].previewNode != (SyntaxNode *)0x0) {
            AVar19 = SemanticFacts::getDirection(*(TokenKind *)&pSVar39[3].parent);
          }
          pPVar26->direction = AVar19;
          (pPVar26->super_Symbol).originatingSyntax = pSVar39;
          sVar34 = *(size_t *)(pSVar39 + 3);
          Symbol::setAttributes
                    (&pPVar26->super_Symbol,(Scope *)local_358._8_8_,
                     *(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                       *)&pSVar39[2].previewNode);
          TVar71.info = (Info *)implicitMembers;
          TVar71.kind = (short)sVar34;
          TVar71._2_1_ = (char)(sVar34 >> 0x10);
          TVar71.numFlags.raw = (char)(sVar34 >> 0x18);
          TVar71.rawLen = (int)(sVar34 >> 0x20);
          if (*(long *)(pSVar39 + 6) == 0) {
            pPVar26->isNullPort = true;
          }
          local_358._24_4_ = pPVar26->direction;
          local_328 = (DefinitionSymbol *)0x0;
          cStack_320 = '\0';
          acStack_31f[0] = '\0';
          acStack_31f[1] = '\0';
          acStack_31f[2] = '\0';
          acStack_31f[3] = '\0';
          acStack_31f[4] = '\0';
          acStack_31f[5] = '\0';
          acStack_31f[6] = '\0';
          local_338 = (undefined1  [16])0x0;
          local_318 = (NetType *)0x48a5a6;
          local_310 = false;
          local_430.first._M_len = (size_t)pPVar26;
        }
        SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                  ((SmallVectorBase<slang::ast::Symbol_const*> *)local_438,(Symbol **)&local_430);
        implicitMembers =
             (SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *)
             TVar71.info;
        lVar46 = lVar46 + 0x30;
        uVar38 = uVar38 - 1;
      } while (uVar38 != 0);
    }
    if (local_398 ==
        (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
         *)0x0) {
      return;
    }
    local_430.first =
         (basic_string_view<char,_std::char_traits<char>_>)
         slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)local_3c0->data_);
    SVar20 = parsing::Token::location((Token *)&local_430);
    Scope::addDiag(local_3c8,(DiagCode)0x9f0006,SVar20);
    return;
  }
  local_358._0_8_ = *(undefined8 *)&syntax->super_SyntaxNode;
  local_78 = (Storage *)local_338;
  local_70._8_8_ = 0x3f;
  local_70._16_8_ = (arrays_type *)0x1;
  stack0xffffffffffffffa8 = ZEXT816(0x49b460);
  local_48 = 0;
  local_40 = 0;
  local_70._0_8_ = local_78;
  if (in_R9 != (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                *)0x0) {
    local_398 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                 *)(implicitMembers->firstElement + (long)in_R9 * 0x10 + -0x18);
    do {
      ppVar5 = implicitMembers->data_;
      local_370 = (Symbol *)implicitMembers->len;
      local_3c0 = implicitMembers;
      if (*(int *)&ppVar5->first == 0x16f) {
        pbVar37 = (byte *)((long)&(ppVar5[8].second)->kind + 1);
        if ((byte *)0x1 < pbVar37) {
          local_448 = (Token *)((ulong)pbVar37 >> 1);
          pTVar49 = (Token *)0x0;
          do {
            ppSVar25 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                 ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   *)(&(ppVar5[8].first)->kind + (long)pTVar49 * 0xc));
            pSVar39 = *ppSVar25;
            local_468._0_16_ = *(undefined1 (*) [16])(pSVar39 + 1);
            if ((local_468._0_16_ & (undefined1  [16])0x10000) == (undefined1  [16])0x0) {
              _local_498 = parsing::Token::valueText((Token *)local_468);
              local_430.second.syntax.ptr = (DeclaratorSyntax *)ppVar5[4].second;
              local_430.first._M_str = (char *)ppVar5[4].first;
              local_430.first._M_len = (size_t)pSVar39;
              local_430.second.ifaceDef._0_6_ = 0;
              local_430.second._46_8_ = 0;
              local_430.second.internalSymbol = (Symbol *)0x0;
              local_430.second.insertionPoint._0_6_ = 0;
              local_430.second.insertionPoint._6_2_ = 0;
              local_430.second.attrs._M_ptr = (pointer)0x0;
              local_430.second.attrs._M_extent._M_extent_value = 0;
              ppVar21 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                         *)hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                           operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                       *)local_70,
                                      (basic_string_view<char,_std::char_traits<char>_> *)local_498)
              ;
              ppVar36 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                         *)((ulong)ppVar21 >> (local_70[8] & 0x3f));
              lVar46 = ((ulong)ppVar21 & 0xff) * 4;
              uVar54 = (&UNK_0049b57c)[lVar46];
              uVar56 = (&UNK_0049b57d)[lVar46];
              uVar57 = (&UNK_0049b57e)[lVar46];
              uVar58 = (&UNK_0049b57f)[lVar46];
              local_390 = ppStack_50;
              auVar15 = local_498;
              local_440 = local_490;
              uVar38 = (ulong)((uint)ppVar21 & 7);
              paVar41 = (arrays_type *)0x0;
              pSVar39 = (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)
                        local_70._24_8_;
              paVar40 = (arrays_type *)local_70._16_8_;
              ppVar43 = ppVar36;
              uVar59 = uVar54;
              uVar60 = uVar56;
              uVar61 = uVar57;
              uVar62 = uVar58;
              uVar63 = uVar54;
              uVar64 = uVar56;
              uVar65 = uVar57;
              uVar66 = uVar58;
              uVar67 = uVar54;
              uVar68 = uVar56;
              uVar69 = uVar57;
              uVar70 = uVar58;
              do {
                ppVar47 = local_390;
                paVar45 = (arrays_type *)((long)ppVar43 * 0x10);
                puVar2 = (uchar *)((long)&paVar45->groups_size_index + (long)&pSVar39->kind);
                auVar50[0] = -(*puVar2 == uVar54);
                auVar50[1] = -(puVar2[1] == uVar56);
                auVar50[2] = -(puVar2[2] == uVar57);
                auVar50[3] = -(puVar2[3] == uVar58);
                auVar50[4] = -(puVar2[4] == uVar59);
                auVar50[5] = -(puVar2[5] == uVar60);
                auVar50[6] = -(puVar2[6] == uVar61);
                auVar50[7] = -(puVar2[7] == uVar62);
                auVar50[8] = -(puVar2[8] == uVar63);
                auVar50[9] = -(puVar2[9] == uVar64);
                auVar50[10] = -(puVar2[10] == uVar65);
                auVar50[0xb] = -(puVar2[0xb] == uVar66);
                auVar50[0xc] = -(puVar2[0xc] == uVar67);
                auVar50[0xd] = -(puVar2[0xd] == uVar68);
                auVar50[0xe] = -(puVar2[0xe] == uVar69);
                auVar50[0xf] = -(puVar2[0xf] == uVar70);
                uVar31 = (uint)(ushort)((ushort)(SUB161(auVar50 >> 7,0) & 1) |
                                        (ushort)(SUB161(auVar50 >> 0xf,0) & 1) << 1 |
                                        (ushort)(SUB161(auVar50 >> 0x17,0) & 1) << 2 |
                                        (ushort)(SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
                                        (ushort)(SUB161(auVar50 >> 0x27,0) & 1) << 4 |
                                        (ushort)(SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
                                        (ushort)(SUB161(auVar50 >> 0x37,0) & 1) << 6 |
                                        (ushort)(SUB161(auVar50 >> 0x3f,0) & 1) << 7 |
                                        (ushort)(SUB161(auVar50 >> 0x47,0) & 1) << 8 |
                                        (ushort)(SUB161(auVar50 >> 0x4f,0) & 1) << 9 |
                                        (ushort)(SUB161(auVar50 >> 0x57,0) & 1) << 10 |
                                        (ushort)(SUB161(auVar50 >> 0x5f,0) & 1) << 0xb |
                                        (ushort)(SUB161(auVar50 >> 0x67,0) & 1) << 0xc |
                                        (ushort)(SUB161(auVar50 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar50 >> 0x77,0) & 1) << 0xe);
                ppVar42 = ppVar43;
                paVar44 = paVar41;
                if (uVar31 != 0) {
                  local_388._0_2_ = CONCAT11(uVar56,uVar54);
                  local_388._0_3_ = CONCAT12(uVar57,(undefined2)local_388);
                  local_388._0_4_ = CONCAT13(uVar58,(undefined3)local_388);
                  local_388._0_5_ = CONCAT14(uVar59,(undefined4)local_388);
                  local_388._0_6_ = CONCAT15(uVar60,(undefined5)local_388);
                  local_388._0_7_ = CONCAT16(uVar61,(undefined6)local_388);
                  local_388 = (PortInfo *)CONCAT17(uVar62,(undefined7)local_388);
                  in_R9 = ppVar43;
                  local_430.second.modport._M_str = (char *)ppVar43;
                  local_430.second._64_8_ = uVar38;
                  local_3d8 = ppVar36;
                  local_3d0 = ppVar21;
                  local_3b8 = paVar45;
                  local_3b0 = paVar41;
                  local_3a8 = paVar40;
                  local_3a0 = pSVar39;
                  uStack_380 = uVar63;
                  uStack_37f = uVar64;
                  uStack_37e = uVar65;
                  uStack_37d = uVar66;
                  uStack_37c = uVar67;
                  uStack_37b = uVar68;
                  uStack_37a = uVar69;
                  uStack_379 = uVar70;
                  do {
                    uVar10 = 0;
                    if (uVar31 != 0) {
                      for (; (uVar31 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                      }
                    }
                    unaff_R14 = ppVar47 + (long)ppVar43 * 0xf + (ulong)uVar10;
                    SVar20 = (SourceLocation)
                             ppVar47[(long)ppVar43 * 0xf + (ulong)uVar10].first._M_len;
                    bVar17 = (SourceLocation)auVar15 == SVar20;
                    if (((SourceLocation)auVar15 != (SourceLocation)0x0) &&
                       ((SourceLocation)auVar15 == SVar20)) {
                      iVar18 = bcmp(local_440,(unaff_R14->first)._M_str,(size_t)auVar15);
                      bVar17 = iVar18 == 0;
                      uVar54 = (uchar)local_388;
                      uVar56 = local_388._1_1_;
                      uVar57 = local_388._2_1_;
                      uVar58 = local_388._3_1_;
                      uVar59 = local_388._4_1_;
                      uVar60 = local_388._5_1_;
                      uVar61 = local_388._6_1_;
                      uVar62 = local_388._7_1_;
                      uVar63 = uStack_380;
                      uVar64 = uStack_37f;
                      uVar65 = uStack_37e;
                      uVar66 = uStack_37d;
                      uVar67 = uStack_37c;
                      uVar68 = uStack_37b;
                      uVar69 = uStack_37a;
                      uVar70 = uStack_379;
                    }
                    ppVar36 = local_3d8;
                    ppVar21 = local_3d0;
                    if (bVar17) goto LAB_00282dbb;
                    uVar31 = uVar31 - 1 & uVar31;
                    uVar38 = local_430.second._64_8_;
                    pSVar39 = local_3a0;
                    paVar40 = local_3a8;
                    ppVar42 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                               *)local_430.second.modport._M_str;
                    paVar44 = local_3b0;
                    paVar45 = local_3b8;
                  } while (uVar31 != 0);
                }
                in_R9 = ppVar42;
                if ((*(byte *)((long)&pSVar39->parent +
                              (long)((long)&paVar45->groups_size_index + 7)) &
                    (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      is_not_overflowed(unsigned_long)::shift)[uVar38]) == 0) break;
                paVar41 = (arrays_type *)((long)&paVar44->groups_size_index + 1);
                ppVar43 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                           *)((ulong)((long)&paVar44->groups_size_index +
                                     (long)((long)&(ppVar42->first)._M_len + 1)) & (ulong)paVar40);
                in_R9 = ppVar43;
              } while (paVar41 <= paVar40);
              unaff_R14 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                           *)0x0;
LAB_00282dbb:
              syntax = (PortListSyntax *)local_3c8;
              ppVar43 = ppVar21;
              ppVar47 = unaff_R14;
              if (unaff_R14 ==
                  (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                   *)0x0) {
                if (local_40 < local_48) {
                  ppVar43 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                             *)local_498;
                  in_R9 = &local_430;
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,704ul,16ul>>
                  ::
                  nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                            (&local_488,local_70 + 8,(arrays_type *)ppVar36,(size_t)ppVar21,
                             (size_t)ppVar43,(try_emplace_args_t *)in_R9,in_stack_fffffffffffffb48,
                             in_stack_fffffffffffffb50);
                  local_40 = local_40 + 1;
                  ppVar47 = local_488.p;
                }
                else {
                  ppVar43 = &local_430;
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,704ul,16ul>>
                  ::
                  unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                            (&local_488,local_70,(size_t)ppVar21,(try_emplace_args_t *)local_498,
                             &ppVar43->first,(PortInfo *)in_R9);
                  ppVar47 = local_488.p;
                }
              }
              flags.m_bits = (underlying_type)ppVar43;
              if (unaff_R14 ==
                  (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                   *)0x0) {
                (ppVar47->second).insertionPoint = local_370;
                pSVar28 = ppVar5[5].first;
                pDVar8 = (ppVar47->second).syntax.ptr;
                local_440 = unaff_R14;
                local_488._0_16_ = parsing::Token::valueText(&pDVar8->name);
                SVar20 = parsing::Token::location(&pDVar8->name);
                local_498 = (undefined1  [8])SVar20;
                SVar4 = (((PortHeaderSyntax *)&pSVar28->kind)->super_SyntaxNode).kind;
                if (SVar4 == InterfacePortHeader) {
                  anon_unknown_0::getInterfacePortInfo
                            ((tuple<const_slang::ast::DefinitionSymbol_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
                              *)&local_430,(Scope *)local_358._8_8_,
                             (InterfacePortHeaderSyntax *)pSVar28);
                  uVar14 = local_358._8_8_;
                  (ppVar47->second).isIface = true;
                  (ppVar47->second).ifaceDef = (DefinitionSymbol *)local_430.second.syntax.ptr;
                  (ppVar47->second).modport._M_len = local_430.first._M_len;
                  (ppVar47->second).modport._M_str = local_430.first._M_str;
                  if (pDVar8->initializer != (EqualsValueClauseSyntax *)0x0) {
                    SVar73 = slang::syntax::SyntaxNode::sourceRange
                                       (&pDVar8->initializer->super_SyntaxNode);
                    Scope::addDiag((Scope *)uVar14,(DiagCode)0x2f0006,SVar73);
                  }
                }
                else {
                  local_388 = &ppVar47->second;
                  if (SVar4 == NetPortHeader) {
                    AVar19 = SemanticFacts::getDirection(((Token *)&pSVar28->location)->kind);
                    uVar14 = local_358._0_8_;
                    (ppVar47->second).direction = AVar19;
                    pNVar27 = Compilation::getNetType
                                        ((Compilation *)local_358._0_8_,
                                         *(TokenKind *)&pSVar28->nextInScope);
                    pNVar22 = BumpAllocator::
                              emplace<slang::ast::NetSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::NetType_const&>
                                        ((BumpAllocator *)uVar14,
                                         (basic_string_view<char,_std::char_traits<char>_> *)
                                         &local_488,(SourceLocation *)local_498,pNVar27);
                    pSVar33 = pSVar28->originatingSyntax;
LAB_00282f05:
                    anon_unknown_0::NonAnsiPortListBuilder::setInternalSymbol
                              ((NonAnsiPortListBuilder *)local_358,&pNVar22->super_ValueSymbol,
                               pDVar8,(DataTypeSyntax *)pSVar33,local_388);
                  }
                  else {
                    AVar19 = SemanticFacts::getDirection(*(TokenKind *)&pSVar28->nextInScope);
                    uVar14 = local_358._8_8_;
                    (ppVar47->second).direction = AVar19;
                    if (pSVar28->parentScope != (Scope *)0x0) {
                      SVar73 = parsing::Token::range((Token *)&pSVar28->location);
                      Scope::addDiag((Scope *)uVar14,(DiagCode)0x1e0006,SVar73);
                    }
                    if (*(SyntaxNode **)(pSVar28 + 1) == (SyntaxNode *)0x0) {
                      pDVar35 = (DataTypeSyntax *)pSVar28[1].name._M_len;
                      if ((pDVar35->super_ExpressionSyntax).super_SyntaxNode.kind != ImplicitType) {
                        sVar72 = slang::syntax::SyntaxFacts::getSimpleTypeName(pDVar35);
                        name_00._M_len = sVar72._M_str;
                        name_00._M_str = (char *)0x1;
                        pNVar27 = (NetType *)
                                  Lookup::unqualified((Lookup *)local_358._8_8_,
                                                      (Scope *)sVar72._M_len,name_00,flags);
                        if ((pNVar27 != (NetType *)0x0) && ((pNVar27->super_Symbol).kind == NetType)
                           ) {
                          pNVar22 = BumpAllocator::
                                    emplace<slang::ast::NetSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::NetType_const&>
                                              ((BumpAllocator *)local_358._0_8_,
                                               (basic_string_view<char,_std::char_traits<char>_> *)
                                               &local_488,(SourceLocation *)local_498,pNVar27);
                          pSVar33 = (SyntaxNode *)0x0;
                          goto LAB_00282f05;
                        }
                        goto LAB_00282fd3;
                      }
                      pSVar23 = Scope::find((Scope *)local_358._8_8_,(string_view)local_488._0_16_);
                      uVar14 = local_358._0_8_;
                      if ((pSVar23 == (Symbol *)0x0) || (1 < pSVar23->kind - Net)) {
                        pNVar27 = anon_unknown_0::getDefaultNetType
                                            ((Scope *)local_358._8_8_,(SourceLocation)local_498);
                        pNVar22 = BumpAllocator::
                                  emplace<slang::ast::NetSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::NetType_const&>
                                            ((BumpAllocator *)uVar14,
                                             (basic_string_view<char,_std::char_traits<char>_> *)
                                             &local_488,(SourceLocation *)local_498,pNVar27);
                        goto LAB_00283001;
                      }
                      (ppVar47->second).internalSymbol = pSVar23;
                      pSVar6 = (ppVar47->second).insertionPoint;
                      if (pSVar6 == (Symbol *)0x0) {
                        SVar32 = 1;
                      }
                      else {
                        SVar32 = pSVar6->indexInScope + 1;
                      }
                      if (SVar32 < pSVar23->indexInScope) {
                        *(SymbolIndex *)((long)&pSVar23[1].originatingSyntax + 4) =
                             *(SymbolIndex *)((long)&pSVar23[1].originatingSyntax + 4) & 0xc0000000
                             | pSVar23->indexInScope & 0x3fffffff;
                        pSVar23->indexInScope = SVar32;
                      }
                      unpackedDimensions._M_ptr =
                           (pDVar8->dimensions).
                           super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>
                           ._M_ptr;
                      unpackedDimensions._M_extent._M_extent_value =
                           (pDVar8->dimensions).
                           super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>
                           ._M_extent._M_extent_value;
                      DeclaredType::mergeImplicitPort
                                ((DeclaredType *)(pSVar23 + 1),
                                 (ImplicitTypeSyntax *)pSVar28[1].name._M_len,
                                 (SourceLocation)local_498,unpackedDimensions);
                    }
                    else {
LAB_00282fd3:
                      local_430.first._M_len._0_4_ = 1;
                      pNVar22 = (NetSymbol *)
                                BumpAllocator::
                                emplace<slang::ast::VariableSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::VariableLifetime>
                                          ((BumpAllocator *)local_358._0_8_,
                                           (basic_string_view<char,_std::char_traits<char>_> *)
                                           &local_488,(SourceLocation *)local_498,
                                           (VariableLifetime *)&local_430);
LAB_00283001:
                      anon_unknown_0::NonAnsiPortListBuilder::setInternalSymbol
                                ((NonAnsiPortListBuilder *)local_358,&pNVar22->super_ValueSymbol,
                                 pDVar8,(DataTypeSyntax *)pSVar28[1].name._M_len,local_388);
                    }
                    if (((ppVar47->second).direction == InOut) &&
                       (((ppVar47->second).internalSymbol)->kind != Net)) {
                      pDVar29 = Scope::addDiag((Scope *)local_358._8_8_,(DiagCode)0x490006,
                                               (SourceLocation)local_498);
                      Diagnostic::operator<<(pDVar29,(string_view)local_488._0_16_);
                    }
                  }
                }
                pSVar28 = (ppVar47->second).internalSymbol;
                if (pSVar28 == (Symbol *)0x0) {
                  bVar17 = false;
                }
                else {
                  bVar17 = pSVar28->kind == Net;
                }
                if ((bool)((ppVar47->second).direction == Ref & bVar17)) {
                  pDVar29 = Scope::addDiag((Scope *)local_358._8_8_,(DiagCode)0xbc0006,
                                           (SourceLocation)local_498);
                  Diagnostic::operator<<(pDVar29,(string_view)local_488._0_16_);
                }
                if (((bool)((ppVar47->second).direction == InOut & bVar17)) &&
                   (*(int *)((ppVar47->second).internalSymbol[5].name._M_str + 0x80) == 0xc)) {
                  pDVar29 = Scope::addDiag((Scope *)local_358._8_8_,(DiagCode)0x4a0006,
                                           (SourceLocation)local_498);
                  Diagnostic::operator<<(pDVar29,(string_view)local_488._0_16_);
                }
                uVar14 = local_358._8_8_;
                unaff_R14 = local_440;
                if (((ppVar47->second).direction != Out || bVar17) &&
                   (pDVar8->initializer != (EqualsValueClauseSyntax *)0x0)) {
                  SVar73 = slang::syntax::SyntaxNode::sourceRange
                                     (&pDVar8->initializer->super_SyntaxNode);
                  Scope::addDiag((Scope *)uVar14,(DiagCode)0x2f0006,SVar73);
                  unaff_R14 = local_440;
                }
              }
              else {
                SVar20 = parsing::Token::location((Token *)local_468);
                pDVar29 = Scope::addDiag((Scope *)syntax,(DiagCode)0x2a000a,SVar20);
                sVar72 = parsing::Token::valueText((Token *)local_468);
                Diagnostic::operator<<(pDVar29,sVar72);
                SVar20 = parsing::Token::location(&((ppVar47->second).syntax.ptr)->name);
                Diagnostic::addNote(pDVar29,(DiagCode)0xa0001,SVar20);
              }
            }
            pTVar49 = (Token *)((long)&pTVar49->kind + 1);
            this = local_470;
          } while (pTVar49 != local_448);
        }
      }
      else {
        sVar72 = parsing::Token::valueText((Token *)((long)(ppVar5[8].second)->location + 0x18));
        Compilation::tryGetDefinition
                  ((DefinitionLookupResult *)&local_430,(Compilation *)local_358._0_8_,sVar72,
                   (Scope *)syntax);
        pbVar37 = (byte *)((long)&(ppVar5[0xc].first)->kind + 1);
        if ((byte *)0x1 < pbVar37) {
          local_368 = (DefinitionSymbol *)local_430.first._M_len;
          ppVar36 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                     *)((ulong)pbVar37 >> 1);
          ppVar21 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                     *)0x0;
          local_440 = unaff_R14;
          local_430.second.modport._M_str = (char *)ppVar36;
          do {
            ppSVar25 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                 ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   *)(&(ppVar5[0xb].second)->kind + (long)ppVar21 * 0xc));
            pSVar39 = *ppSVar25;
            local_468._0_16_ = *(undefined1 (*) [16])(pSVar39 + 1);
            if ((local_468._0_16_ & (undefined1  [16])0x10000) == (undefined1  [16])0x0) {
              _local_498 = parsing::Token::valueText((Token *)local_468);
              local_430.second.syntax.ptr = (DeclaratorSyntax *)ppVar5[4].second;
              local_430.first._M_str = (char *)ppVar5[4].first;
              local_430.first._M_len = (size_t)pSVar39;
              local_430.second.ifaceDef._0_6_ = 0;
              local_430.second._46_8_ = 0;
              local_430.second.internalSymbol = (Symbol *)0x0;
              local_430.second.insertionPoint._0_6_ = 0;
              local_430.second.insertionPoint._6_2_ = 0;
              local_430.second.attrs._M_ptr = (pointer)0x0;
              local_430.second.attrs._M_extent._M_extent_value = 0;
              local_3a0 = pSVar39;
              local_430.second._64_8_ =
                   hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              local_70,(basic_string_view<char,_std::char_traits<char>_> *)local_498
                             );
              paVar40 = (arrays_type *)((ulong)local_430.second._64_8_ >> (local_70[8] & 0x3f));
              uVar14 = local_70._24_8_;
              lVar46 = (local_430.second._64_8_ & 0xff) * 4;
              uVar54 = (&UNK_0049b57c)[lVar46];
              uVar56 = (&UNK_0049b57d)[lVar46];
              uVar57 = (&UNK_0049b57e)[lVar46];
              uVar58 = (&UNK_0049b57f)[lVar46];
              local_3d8 = ppStack_50;
              auVar15 = local_498;
              local_448 = (Token *)local_490;
              uVar38 = (ulong)((uint)local_430.second._64_8_ & 7);
              local_3b8 = (arrays_type *)local_70._16_8_;
              paVar41 = (arrays_type *)0x0;
              uVar59 = uVar54;
              uVar60 = uVar56;
              uVar61 = uVar57;
              uVar62 = uVar58;
              uVar63 = uVar54;
              uVar64 = uVar56;
              uVar65 = uVar57;
              uVar66 = uVar58;
              uVar67 = uVar54;
              uVar68 = uVar56;
              uVar69 = uVar57;
              uVar70 = uVar58;
              local_3a8 = paVar40;
              do {
                local_3d0 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                             *)((long)paVar40 * 0x10);
                pgVar3 = (group_type_pointer)(uVar14 + paVar40 * 0x10);
                auVar51[0] = -(pgVar3->m[0].n == uVar54);
                auVar51[1] = -(pgVar3->m[1].n == uVar56);
                auVar51[2] = -(pgVar3->m[2].n == uVar57);
                auVar51[3] = -(pgVar3->m[3].n == uVar58);
                auVar51[4] = -(pgVar3->m[4].n == uVar59);
                auVar51[5] = -(pgVar3->m[5].n == uVar60);
                auVar51[6] = -(pgVar3->m[6].n == uVar61);
                auVar51[7] = -(pgVar3->m[7].n == uVar62);
                auVar51[8] = -(pgVar3->m[8].n == uVar63);
                auVar51[9] = -(pgVar3->m[9].n == uVar64);
                auVar51[10] = -(pgVar3->m[10].n == uVar65);
                auVar51[0xb] = -(pgVar3->m[0xb].n == uVar66);
                auVar51[0xc] = -(pgVar3->m[0xc].n == uVar67);
                auVar51[0xd] = -(pgVar3->m[0xd].n == uVar68);
                auVar51[0xe] = -(pgVar3->m[0xe].n == uVar69);
                auVar51[0xf] = -(pgVar3->m[0xf].n == uVar70);
                uVar31 = (uint)(ushort)((ushort)(SUB161(auVar51 >> 7,0) & 1) |
                                        (ushort)(SUB161(auVar51 >> 0xf,0) & 1) << 1 |
                                        (ushort)(SUB161(auVar51 >> 0x17,0) & 1) << 2 |
                                        (ushort)(SUB161(auVar51 >> 0x1f,0) & 1) << 3 |
                                        (ushort)(SUB161(auVar51 >> 0x27,0) & 1) << 4 |
                                        (ushort)(SUB161(auVar51 >> 0x2f,0) & 1) << 5 |
                                        (ushort)(SUB161(auVar51 >> 0x37,0) & 1) << 6 |
                                        (ushort)(SUB161(auVar51 >> 0x3f,0) & 1) << 7 |
                                        (ushort)(SUB161(auVar51 >> 0x47,0) & 1) << 8 |
                                        (ushort)(SUB161(auVar51 >> 0x4f,0) & 1) << 9 |
                                        (ushort)(SUB161(auVar51 >> 0x57,0) & 1) << 10 |
                                        (ushort)(SUB161(auVar51 >> 0x5f,0) & 1) << 0xb |
                                        (ushort)(SUB161(auVar51 >> 0x67,0) & 1) << 0xc |
                                        (ushort)(SUB161(auVar51 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar51 >> 0x77,0) & 1) << 0xe);
                local_3b0 = paVar40;
                if (uVar31 != 0) {
                  ppVar43 = local_3d8 + (long)paVar40 * 0xf;
                  local_388._0_2_ = CONCAT11(uVar56,uVar54);
                  local_388._0_3_ = CONCAT12(uVar57,(undefined2)local_388);
                  local_388._0_4_ = CONCAT13(uVar58,(undefined3)local_388);
                  local_388._0_5_ = CONCAT14(uVar59,(undefined4)local_388);
                  local_388._0_6_ = CONCAT15(uVar60,(undefined5)local_388);
                  local_388._0_7_ = CONCAT16(uVar61,(undefined6)local_388);
                  local_388 = (PortInfo *)CONCAT17(uVar62,(undefined7)local_388);
                  local_390 = ppVar43;
                  uStack_380 = uVar63;
                  uStack_37f = uVar64;
                  uStack_37e = uVar65;
                  uStack_37d = uVar66;
                  uStack_37c = uVar67;
                  uStack_37b = uVar68;
                  uStack_37a = uVar69;
                  uStack_379 = uVar70;
                  local_360 = uVar38;
                  do {
                    uVar10 = 0;
                    if (uVar31 != 0) {
                      for (; (uVar31 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                      }
                    }
                    ppVar47 = ppVar43 + uVar10;
                    SVar20 = (SourceLocation)ppVar43[uVar10].first._M_len;
                    bVar17 = (SourceLocation)auVar15 == SVar20;
                    if (((SourceLocation)auVar15 != (SourceLocation)0x0) &&
                       ((SourceLocation)auVar15 == SVar20)) {
                      iVar18 = bcmp(local_448,(ppVar47->first)._M_str,(size_t)auVar15);
                      bVar17 = iVar18 == 0;
                      ppVar43 = local_390;
                      uVar54 = (uchar)local_388;
                      uVar56 = local_388._1_1_;
                      uVar57 = local_388._2_1_;
                      uVar58 = local_388._3_1_;
                      uVar59 = local_388._4_1_;
                      uVar60 = local_388._5_1_;
                      uVar61 = local_388._6_1_;
                      uVar62 = local_388._7_1_;
                      uVar63 = uStack_380;
                      uVar64 = uStack_37f;
                      uVar65 = uStack_37e;
                      uVar66 = uStack_37d;
                      uVar67 = uStack_37c;
                      uVar68 = uStack_37b;
                      uVar69 = uStack_37a;
                      uVar70 = uStack_379;
                    }
                    syntax = (PortListSyntax *)local_3c8;
                    ppVar36 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                               *)local_430.second.modport._M_str;
                    unaff_R14 = local_440;
                    if (bVar17) goto LAB_00283537;
                    uVar31 = uVar31 - 1 & uVar31;
                    uVar38 = local_360;
                  } while (uVar31 != 0);
                }
                if ((((slot_type *)uVar14)[(long)((long)&(local_3d0->first)._M_str + 7)].n &
                    (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      is_not_overflowed(unsigned_long)::shift)[uVar38]) == 0) break;
                psVar13 = &paVar41->groups_size_index;
                paVar41 = (arrays_type *)((long)&paVar41->groups_size_index + 1);
                paVar40 = (arrays_type *)
                          ((ulong)((long)psVar13 + (long)((long)&local_3b0->groups_size_index + 1))
                          & (ulong)local_3b8);
              } while (paVar41 <= local_3b8);
              local_450 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                           *)0x0;
              ppVar47 = local_450;
LAB_00283537:
              local_450 = ppVar47;
              ppVar43 = local_450;
              if (local_450 ==
                  (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                   *)0x0) {
                if (local_40 < local_48) {
                  in_R9 = &local_430;
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,704ul,16ul>>
                  ::
                  nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                            (&local_488,local_70 + 8,local_3a8,local_430.second._64_8_,
                             (size_t)local_498,(try_emplace_args_t *)in_R9,in_stack_fffffffffffffb48
                             ,in_stack_fffffffffffffb50);
                  local_40 = local_40 + 1;
                  ppVar43 = local_488.p;
                }
                else {
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,704ul,16ul>>
                  ::
                  unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                            (&local_488,local_70,local_430.second._64_8_,
                             (try_emplace_args_t *)local_498,&local_430.first,(PortInfo *)in_R9);
                  ppVar43 = local_488.p;
                }
              }
              if (local_450 ==
                  (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                   *)0x0) {
                (ppVar43->second).isIface = true;
                (ppVar43->second).ifaceDef = local_368;
                (ppVar43->second).insertionPoint = local_370;
                if (*(SyntaxNode **)(local_3a0 + 4) != (SyntaxNode *)0x0) {
                  SVar73 = slang::syntax::SyntaxNode::sourceRange(*(SyntaxNode **)(local_3a0 + 4));
                  Scope::addDiag((Scope *)syntax,(DiagCode)0x2f0006,SVar73);
                }
              }
              else {
                SVar20 = parsing::Token::location((Token *)local_468);
                pDVar29 = Scope::addDiag((Scope *)syntax,(DiagCode)0x2a000a,SVar20);
                sVar72 = parsing::Token::valueText((Token *)local_468);
                Diagnostic::operator<<(pDVar29,sVar72);
                SVar20 = parsing::Token::location(&((ppVar43->second).syntax.ptr)->name);
                Diagnostic::addNote(pDVar29,(DiagCode)0xa0001,SVar20);
              }
            }
            ppVar21 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                       *)((long)&(ppVar21->first)._M_len + 1);
            this = local_470;
          } while (ppVar21 != ppVar36);
        }
      }
      implicitMembers =
           (SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *)
           &local_3c0->cap;
    } while ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
              *)implicitMembers != local_398);
  }
  pbVar37 = (byte *)((long)&(this->type->super_Symbol).kind + 1);
  if ((byte *)0x1 < pbVar37) {
    uVar38 = (ulong)pbVar37 >> 1;
    lVar46 = 0;
    do {
      ppSVar25 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                           ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                            (*(long *)&local_470->direction + lVar46));
      uVar14 = local_358._0_8_;
      pSVar39 = *ppSVar25;
      if (pSVar39->kind == EmptyNonAnsiPort) {
        SVar20 = parsing::Token::location((Token *)(pSVar39 + 1));
        local_430.first._M_len = (size_t)SVar20;
        auVar11[0xf] = 0;
        auVar11._0_15_ = local_468._1_15_;
        local_468._0_16_ = auVar11 << 8;
        pPVar26 = BumpAllocator::
                  emplace<slang::ast::PortSymbol,char_const(&)[1],slang::SourceLocation,bool>
                            ((BumpAllocator *)uVar14,(char (*) [1])0x48a5a6,
                             (SourceLocation *)&local_430,(bool *)local_468);
        pPVar26->direction = In;
        (pPVar26->super_Symbol).originatingSyntax = pSVar39;
        pPVar26->isNullPort = true;
        local_488.pg = (group15<boost::unordered::detail::foa::plain_integral> *)pPVar26;
        SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                  ((SmallVectorBase<slang::ast::Symbol_const*> *)local_438,(Symbol **)&local_488);
      }
      else if (pSVar39->kind == ExplicitNonAnsiPort) {
        local_430.first = parsing::Token::valueText((Token *)&pSVar39[1].previewNode);
        SVar20 = parsing::Token::location((Token *)&pSVar39[1].previewNode);
        local_488.pg = (group15<boost::unordered::detail::foa::plain_integral> *)SVar20;
        pPVar7 = *(PortConcatenationSyntax **)(pSVar39 + 3);
        if (pPVar7 == (PortConcatenationSyntax *)0x0) {
          auVar12[0xf] = 0;
          auVar12._0_15_ = stack0xfffffffffffffb69;
          _local_498 = (string_view)(auVar12 << 8);
          pPVar26 = BumpAllocator::
                    emplace<slang::ast::PortSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,bool>
                              ((BumpAllocator *)local_358._0_8_,&local_430.first,
                               (SourceLocation *)&local_488,(bool *)local_498);
          pPVar26->direction = In;
          (pPVar26->super_Symbol).originatingSyntax = pSVar39;
          pPVar26->isNullPort = true;
        }
        else if ((pPVar7->super_PortExpressionSyntax).super_SyntaxNode.kind == PortReference) {
          pPVar26 = (PortSymbol *)
                    anon_unknown_0::NonAnsiPortListBuilder::createPort
                              ((NonAnsiPortListBuilder *)local_358,local_430.first,SVar20,
                               (PortReferenceSyntax *)pPVar7);
        }
        else {
          pPVar26 = (PortSymbol *)
                    anon_unknown_0::NonAnsiPortListBuilder::createPort
                              ((NonAnsiPortListBuilder *)local_358,local_430.first,SVar20,pPVar7);
        }
        local_468._0_8_ = pPVar26;
        SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                  ((SmallVectorBase<slang::ast::Symbol_const*> *)local_438,(Symbol **)local_468);
      }
      else {
        local_430.first =
             (basic_string_view<char,_std::char_traits<char>_>)
             slang::syntax::SyntaxNode::getFirstToken(*(SyntaxNode **)(pSVar39 + 1));
        SVar20 = parsing::Token::location((Token *)&local_430);
        pPVar7 = *(PortConcatenationSyntax **)(pSVar39 + 1);
        if ((pPVar7->super_PortExpressionSyntax).super_SyntaxNode.kind == PortReference) {
          pSVar28 = anon_unknown_0::NonAnsiPortListBuilder::createPort
                              ((NonAnsiPortListBuilder *)local_358,
                               (string_view)(ZEXT816(0x48a5a6) << 0x40),SVar20,
                               (PortReferenceSyntax *)pPVar7);
        }
        else {
          pSVar28 = anon_unknown_0::NonAnsiPortListBuilder::createPort
                              ((NonAnsiPortListBuilder *)local_358,
                               (string_view)(ZEXT816(0x48a5a6) << 0x40),SVar20,pPVar7);
        }
        local_488.pg = (group15<boost::unordered::detail::foa::plain_integral> *)pSVar28;
        SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                  ((SmallVectorBase<slang::ast::Symbol_const*> *)local_438,(Symbol **)&local_488);
      }
      lVar46 = lVar46 + 0x30;
      uVar38 = uVar38 - 1;
    } while (uVar38 != 0);
  }
  psVar24 = (slot_type *)local_70._24_8_;
  ppVar36 = ppStack_50;
  uVar14 = local_358._8_8_;
  if ((ppStack_50 != (value_type_pointer)0x0) &&
     (auVar52[0] = -(*(uchar *)local_70._24_8_ == '\0'), auVar52._1_7_ = 0,
     auVar52[8] = -(((slot_type *)(local_70._24_8_ + 8))->n == '\0'),
     auVar52[9] = -(((slot_type *)(local_70._24_8_ + 9))->n == '\0'),
     auVar52[10] = -(((slot_type *)(local_70._24_8_ + 10))->n == '\0'),
     auVar52[0xb] = -(((slot_type *)(local_70._24_8_ + 0xb))->n == '\0'),
     auVar52[0xc] = -(((slot_type *)(local_70._24_8_ + 0xc))->n == '\0'),
     auVar52[0xd] = -(((slot_type *)(local_70._24_8_ + 0xd))->n == '\0'),
     auVar52[0xe] = -(((slot_type *)(local_70._24_8_ + 0xe))->n == '\0'),
     auVar52[0xf] = -(*(char *)(local_70._24_8_ + 0xf) == '\0'),
     (auVar52 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
    psVar16 = (slot_type *)(local_70._24_8_ + 2);
    do {
      psVar48 = psVar16;
      ppVar36 = ppVar36 + 1;
      if (((uint)psVar24 & 0xf) == 0xe) goto LAB_00284035;
      uVar54 = ((group15<boost::unordered::detail::foa::plain_integral> *)(psVar48 + -1))->m[0].n;
      psVar24 = psVar24 + 1;
      psVar16 = psVar48 + 1;
    } while (uVar54 == '\0');
    psVar24 = psVar48 + -1;
    if (uVar54 == '\x01') {
      ppVar36 = (value_type_pointer)0x0;
    }
  }
joined_r0x002838e3:
  do {
    local_358._8_8_ = uVar14;
    if (ppVar36 == (value_type_pointer)0x0) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_704UL,_16UL>_>
      ::delete_arrays((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_704UL,_16UL>_>
                       *)local_70,(arrays_type *)(local_70 + 8));
      return;
    }
    if (*(bool *)&((PortInfo *)((long)ppVar36 + 0x54))->syntax == false) {
      SVar73 = slang::syntax::SyntaxNode::sourceRange
                         (&((((PortInfo *)((long)ppVar36 + 0x10))->syntax).ptr)->super_SyntaxNode);
      pDVar29 = Scope::addDiag((Scope *)uVar14,(DiagCode)0xd40006,SVar73);
      Diagnostic::operator<<(pDVar29,ppVar36->first);
    }
    psVar16 = (slot_type *)((long)psVar24 + 2);
    do {
      psVar48 = psVar16;
      ppVar36 = ppVar36 + 1;
      uVar14 = local_358._8_8_;
      if (((uint)psVar24 & 0xf) == 0xe) goto LAB_00283961;
      psVar24 = psVar24 + 1;
      psVar16 = psVar48 + 1;
    } while (psVar48[-1].n == '\0');
    psVar24 = psVar48 + -1;
    if (psVar48[-1].n == '\x01') {
      ppVar36 = (value_type_pointer)0x0;
    }
  } while( true );
LAB_00284035:
  do {
    auVar55[0] = -(psVar48->n == '\0');
    auVar55[1] = -(psVar48[1].n == '\0');
    auVar55[2] = -(psVar48[2].n == '\0');
    auVar55[3] = -(psVar48[3].n == '\0');
    auVar55[4] = -(psVar48[4].n == '\0');
    auVar55[5] = -(psVar48[5].n == '\0');
    auVar55[6] = -(psVar48[6].n == '\0');
    auVar55[7] = -(psVar48[7].n == '\0');
    auVar55[8] = -(psVar48[8].n == '\0');
    auVar55[9] = -(psVar48[9].n == '\0');
    auVar55[10] = -(psVar48[10].n == '\0');
    auVar55[0xb] = -(psVar48[0xb].n == '\0');
    auVar55[0xc] = -(psVar48[0xc].n == '\0');
    auVar55[0xd] = -(psVar48[0xd].n == '\0');
    auVar55[0xe] = -(psVar48[0xe].n == '\0');
    auVar55[0xf] = -(*(char *)(psVar48 + 0xf) == '\0');
    uVar31 = (uint)(ushort)((ushort)(SUB161(auVar55 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar55 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar55 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar55 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar55 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar55 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar55 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar55 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar55 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar55 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar55 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar55 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar55 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar55 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar55 >> 0x77,0) & 1) << 0xe);
    if (uVar31 == 0x7fff) {
      psVar48 = psVar48 + 0x10;
      ppVar36 = ppVar36 + 0xf;
    }
    else {
      uVar10 = 0;
      if ((uVar31 ^ 0x7fff) != 0) {
        for (; ((uVar31 ^ 0x7fff) >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
        }
      }
      if (psVar48[uVar10].n == '\x01') {
        ppVar36 = (value_type_pointer)0x0;
      }
      else {
        psVar48 = psVar48 + uVar10;
        ppVar36 = ppVar36 + uVar10;
      }
    }
    psVar24 = psVar48;
  } while (uVar31 == 0x7fff);
  goto joined_r0x002838e3;
LAB_00283961:
  do {
    auVar53[0] = -(psVar48->n == '\0');
    auVar53[1] = -(psVar48[1].n == '\0');
    auVar53[2] = -(psVar48[2].n == '\0');
    auVar53[3] = -(psVar48[3].n == '\0');
    auVar53[4] = -(psVar48[4].n == '\0');
    auVar53[5] = -(psVar48[5].n == '\0');
    auVar53[6] = -(psVar48[6].n == '\0');
    auVar53[7] = -(psVar48[7].n == '\0');
    auVar53[8] = -(psVar48[8].n == '\0');
    auVar53[9] = -(psVar48[9].n == '\0');
    auVar53[10] = -(psVar48[10].n == '\0');
    auVar53[0xb] = -(psVar48[0xb].n == '\0');
    auVar53[0xc] = -(psVar48[0xc].n == '\0');
    auVar53[0xd] = -(*(char *)(psVar48 + 0xd) == '\0');
    auVar53[0xe] = -(*(char *)(psVar48 + 0xe) == '\0');
    auVar53[0xf] = -(*(char *)(psVar48 + 0xf) == '\0');
    uVar31 = (uint)(ushort)((ushort)(SUB161(auVar53 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar53 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar53 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar53 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar53 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar53 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar53 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar53 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar53 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar53 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar53 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar53 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar53 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar53 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar53 >> 0x77,0) & 1) << 0xe);
    if (uVar31 == 0x7fff) {
      psVar48 = psVar48 + 0x10;
      ppVar36 = ppVar36 + 0xf;
    }
    else {
      uVar10 = 0;
      if ((uVar31 ^ 0x7fff) != 0) {
        for (; ((uVar31 ^ 0x7fff) >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
        }
      }
      if (psVar48[uVar10].n == '\x01') {
        ppVar36 = (value_type_pointer)0x0;
      }
      else {
        psVar48 = psVar48 + uVar10;
        ppVar36 = ppVar36 + uVar10;
      }
    }
    psVar24 = psVar48;
  } while (uVar31 == 0x7fff);
  goto joined_r0x002838e3;
}

Assistant:

void PortSymbol::fromSyntax(
    const PortListSyntax& syntax, const Scope& scope, SmallVectorBase<const Symbol*>& results,
    SmallVectorBase<std::pair<Symbol*, const Symbol*>>& implicitMembers,
    std::span<std::pair<const SyntaxNode*, const Symbol*> const> portDeclarations) {

    switch (syntax.kind) {
        case SyntaxKind::AnsiPortList: {
            AnsiPortListBuilder builder{scope, implicitMembers};
            for (auto port : syntax.as<AnsiPortListSyntax>().ports) {
                switch (port->kind) {
                    case SyntaxKind::ImplicitAnsiPort:
                        results.push_back(builder.createPort(port->as<ImplicitAnsiPortSyntax>()));
                        break;
                    case SyntaxKind::ExplicitAnsiPort:
                        results.push_back(builder.createPort(port->as<ExplicitAnsiPortSyntax>()));
                        break;
                    default:
                        SLANG_UNREACHABLE;
                }
            }

            if (!portDeclarations.empty()) {
                scope.addDiag(diag::PortDeclInANSIModule,
                              portDeclarations[0].first->getFirstToken().location());
            }
            break;
        }
        case SyntaxKind::NonAnsiPortList: {
            NonAnsiPortListBuilder builder{scope, portDeclarations, implicitMembers};
            for (auto port : syntax.as<NonAnsiPortListSyntax>().ports) {
                switch (port->kind) {
                    case SyntaxKind::ImplicitNonAnsiPort:
                        results.push_back(
                            builder.createPort(port->as<ImplicitNonAnsiPortSyntax>()));
                        break;
                    case SyntaxKind::ExplicitNonAnsiPort:
                        results.push_back(
                            builder.createPort(port->as<ExplicitNonAnsiPortSyntax>()));
                        break;
                    case SyntaxKind::EmptyNonAnsiPort:
                        results.push_back(builder.createPort(port->as<EmptyNonAnsiPortSyntax>()));
                        break;
                    default:
                        SLANG_UNREACHABLE;
                }
            }
            builder.finalize();
            break;
        }
        default:
            SLANG_UNREACHABLE;
    }
}